

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.hpp
# Opt level: O0

Position Position::from_json(Json *json)

{
  Json *pJVar1;
  uchar ix;
  uchar iy;
  uchar iz;
  bool ihalf_x;
  bool ihalf_y;
  bool ihalf_z;
  Position PVar2;
  const_reference pvVar3;
  bool local_112;
  allocator<char> local_111;
  key_type local_110;
  bool local_ea;
  allocator<char> local_e9;
  key_type local_e8;
  bool local_c2;
  allocator<char> local_c1;
  key_type local_c0;
  allocator<char> local_99;
  key_type local_98;
  allocator<char> local_71;
  key_type local_70;
  allocator<char> local_39;
  key_type local_38;
  Json *local_18;
  Json *json_local;
  
  local_18 = json;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"x",&local_39);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_38);
  ix = nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_unsigned_char<unsigned_char,_0>(pvVar3);
  pJVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"y",&local_71);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pJVar1,&local_70);
  iy = nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_unsigned_char<unsigned_char,_0>(pvVar3);
  pJVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"z",&local_99);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pJVar1,&local_98);
  iz = nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::operator_unsigned_char<unsigned_char,_0>(pvVar3);
  pJVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"halfX",&local_c1);
  local_c2 = false;
  ihalf_x = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::value<bool,_0>(pJVar1,&local_c0,&local_c2);
  pJVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"halfY",&local_e9);
  local_ea = false;
  ihalf_y = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::value<bool,_0>(pJVar1,&local_e8,&local_ea);
  pJVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"halfZ",&local_111);
  local_112 = false;
  ihalf_z = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::value<bool,_0>(pJVar1,&local_110,&local_112);
  Position((Position *)((long)&json_local + 2),ix,iy,iz,ihalf_x,ihalf_y,ihalf_z);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  PVar2.half_y = (bool)json_local._6_1_;
  PVar2.half_z = (bool)json_local._7_1_;
  PVar2.x = json_local._2_1_;
  PVar2.y = json_local._3_1_;
  PVar2.z = json_local._4_1_;
  PVar2.half_x = (bool)json_local._5_1_;
  return PVar2;
}

Assistant:

static Position from_json(const Json& json)
    {
        return {
            json.at("x"), json.at("y"), json.at("z"),
            json.value("halfX", false), json.value("halfY", false), json.value("halfZ", false)
        };
    }